

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

void __thiscall CVmObjFile::check_raw_read(CVmObjFile *this)

{
  check_valid_file(this);
  if ((this->super_CVmObject).ext_[0x15] == '\x02') {
    CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_mode_exc,0,"wrong file mode");
  }
  if ((this->super_CVmObject).ext_[0x14] == '\x03') {
    return;
  }
  CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_mode_exc,0,"wrong file mode");
}

Assistant:

void CVmObjFile::check_raw_read(VMG0_)
{
    check_valid_file(vmg0_);
    check_read_access(vmg0_);
    check_raw_mode(vmg0_);
}